

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O1

void __thiscall Jinx::Variant::SetCollection(Variant *this,CollectionPtr *value)

{
  Destroy(this);
  if ((value->
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr == (element_type *)0x0) {
    this->m_type = Null;
    (this->field_1).m_number = 0.0;
  }
  this->m_type = Collection;
  (this->field_1).m_number = 0.0;
  (this->field_1).m_string._M_string_length = 0;
  (this->field_1).m_string._M_dataplus._M_p =
       (pointer)(value->
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->field_1).m_collection.
              super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(value->
              super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  return;
}

Assistant:

inline_t void Variant::SetCollection(const CollectionPtr & value)
	{
		Destroy();
		if (!value)
		{
			m_type = ValueType::Null;
			m_integer = 0;
		}
		m_type = ValueType::Collection;
		new(&m_collection) CollectionPtr();
		m_collection = value;
	}